

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall
cmake::Run(cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool noconfigure)

{
  bool bVar1;
  WorkingMode WVar2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  undefined1 local_120 [8];
  string message;
  string local_f8;
  int local_d8;
  allocator<char> local_d1;
  int ret;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool noconfigure_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  local_21 = noconfigure;
  pvStack_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  SetArgs(this,args);
  bVar1 = cmSystemTools::GetErrorOccurredFlag();
  if (bVar1) {
    this_local._4_4_ = -1;
  }
  else {
    WVar2 = GetWorkingMode(this);
    if (WVar2 == HELP_MODE) {
      this_local._4_4_ = 0;
    }
    else {
      bVar1 = GetTrace(this);
      if (bVar1) {
        PrintTraceFormatVersion(this);
      }
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (bVar1 = cmakeCheckStampList(&this->CheckStampList), bVar1)) {
        this_local._4_4_ = 0;
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) && (bVar1 = cmakeCheckStampFile(&this->CheckStampFile), bVar1)) {
          this_local._4_4_ = 0;
        }
        else {
          WVar2 = GetWorkingMode(this);
          if (WVar2 == NORMAL_MODE) {
            if ((this->FreshCache & 1U) != 0) {
              psVar5 = GetHomeOutputDirectory_abi_cxx11_(this);
              DeleteCache(this,psVar5);
            }
            iVar3 = LoadCache(this);
            if (iVar3 < 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_48,"Error executing cmake::LoadCache(). Aborting.\n",
                         &local_49);
              cmSystemTools::Error(&local_48);
              std::__cxx11::string::~string((string *)&local_48);
              std::allocator<char>::~allocator(&local_49);
              return -1;
            }
          }
          else {
            if ((this->FreshCache & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_80,"--fresh allowed only when configuring a project",
                         &local_81);
              cmSystemTools::Error(&local_80);
              std::__cxx11::string::~string((string *)&local_80);
              std::allocator<char>::~allocator(&local_81);
              return -1;
            }
            AddCMakePaths(this);
          }
          ProcessPresetVariables(this);
          ProcessPresetEnvironment(this);
          bVar1 = SetCacheArgs(this,pvStack_20);
          if (bVar1) {
            PrintPresetVariables(this);
            PrintPresetEnvironment(this);
            WVar2 = GetWorkingMode(this);
            if (WVar2 == NORMAL_MODE) {
              bVar1 = cmsys::SystemTools::HasEnv("MAKEFLAGS");
              if (bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&ret,"MAKEFLAGS=",&local_d1);
                cmsys::SystemTools::PutEnv((string *)&ret);
                std::__cxx11::string::~string((string *)&ret);
                std::allocator<char>::~allocator(&local_d1);
              }
              PreLoadCMakeFiles(this);
              if ((local_21 & 1) == 0) {
                iVar3 = CheckBuildSystem(this);
                if (iVar3 == 0) {
                  this_local._4_4_ = 0;
                }
                else {
                  local_d8 = Configure(this);
                  this_local._4_4_ = local_d8;
                  if (local_d8 == 0) {
                    local_d8 = Generate(this);
                    if (local_d8 == 0) {
                      cmAlphaNum::cmAlphaNum(&local_150,"Build files have been written to: ");
                      psVar5 = GetHomeOutputDirectory_abi_cxx11_(this);
                      cmAlphaNum::cmAlphaNum(&local_180,psVar5);
                      cmStrCat<>((string *)local_120,&local_150,&local_180);
                      UpdateProgress(this,(string *)local_120,-1.0);
                      this_local._4_4_ = local_d8;
                      std::__cxx11::string::~string((string *)local_120);
                    }
                    else {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_f8,
                                 "CMake Generate step failed.  Build files cannot be regenerated correctly."
                                 ,(allocator<char> *)(message.field_2._M_local_buf + 0xf));
                      cmSystemTools::Message(&local_f8,(char *)0x0);
                      std::__cxx11::string::~string((string *)&local_f8);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(message.field_2._M_local_buf + 0xf));
                      this_local._4_4_ = local_d8;
                    }
                  }
                }
              }
              else {
                this_local._4_4_ = 0;
              }
            }
            else {
              bVar1 = cmSystemTools::GetErrorOccurredFlag();
              if (bVar1) {
                this_local._4_4_ = -1;
              }
              else {
                this_local._4_4_ = 0;
              }
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a8,"Run \'cmake --help\' for all supported options.",
                       &local_a9);
            cmSystemTools::Error(&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
            std::allocator<char>::~allocator(&local_a9);
            this_local._4_4_ = -1;
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Run(const std::vector<std::string>& args, bool noconfigure)
{
  // Process the arguments
  this->SetArgs(args);
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  if (this->GetWorkingMode() == HELP_MODE) {
    return 0;
  }

  // Log the trace format version to the desired output
  if (this->GetTrace()) {
    this->PrintTraceFormatVersion();
  }

  // If we are given a stamp list file check if it is really out of date.
  if (!this->CheckStampList.empty() &&
      cmakeCheckStampList(this->CheckStampList)) {
    return 0;
  }

  // If we are given a stamp file check if it is really out of date.
  if (!this->CheckStampFile.empty() &&
      cmakeCheckStampFile(this->CheckStampFile)) {
    return 0;
  }

  if (this->GetWorkingMode() == NORMAL_MODE) {
    if (this->FreshCache) {
      this->DeleteCache(this->GetHomeOutputDirectory());
    }
    // load the cache
    if (this->LoadCache() < 0) {
      cmSystemTools::Error("Error executing cmake::LoadCache(). Aborting.\n");
      return -1;
    }
  } else {
    if (this->FreshCache) {
      cmSystemTools::Error("--fresh allowed only when configuring a project");
      return -1;
    }
    this->AddCMakePaths();
  }

#ifndef CMAKE_BOOTSTRAP
  this->ProcessPresetVariables();
  this->ProcessPresetEnvironment();
#endif
  // Add any cache args
  if (!this->SetCacheArgs(args)) {
    cmSystemTools::Error("Run 'cmake --help' for all supported options.");
    return -1;
  }
#ifndef CMAKE_BOOTSTRAP
  this->PrintPresetVariables();
  this->PrintPresetEnvironment();
#endif

  // In script mode we terminate after running the script.
  if (this->GetWorkingMode() != NORMAL_MODE) {
    if (cmSystemTools::GetErrorOccurredFlag()) {
      return -1;
    }
    return 0;
  }

  // If MAKEFLAGS are given in the environment, remove the environment
  // variable.  This will prevent try-compile from succeeding when it
  // should fail (if "-i" is an option).  We cannot simply test
  // whether "-i" is given and remove it because some make programs
  // encode the MAKEFLAGS variable in a strange way.
  if (cmSystemTools::HasEnv("MAKEFLAGS")) {
    cmSystemTools::PutEnv("MAKEFLAGS=");
  }

  this->PreLoadCMakeFiles();

  if (noconfigure) {
    return 0;
  }

  // now run the global generate
  // Check the state of the build system to see if we need to regenerate.
  if (!this->CheckBuildSystem()) {
    return 0;
  }

  int ret = this->Configure();
  if (ret) {
#if defined(CMAKE_HAVE_VS_GENERATORS)
    if (!this->VSSolutionFile.empty() && this->GlobalGenerator) {
      // CMake is running to regenerate a Visual Studio build tree
      // during a build from the VS IDE.  The build files cannot be
      // regenerated, so we should stop the build.
      cmSystemTools::Message("CMake Configure step failed.  "
                             "Build files cannot be regenerated correctly.  "
                             "Attempting to stop IDE build.");
      cmGlobalVisualStudioGenerator& gg =
        cm::static_reference_cast<cmGlobalVisualStudioGenerator>(
          this->GlobalGenerator);
      gg.CallVisualStudioMacro(cmGlobalVisualStudioGenerator::MacroStop,
                               this->VSSolutionFile);
    }
#endif
    return ret;
  }
  ret = this->Generate();
  if (ret) {
    cmSystemTools::Message("CMake Generate step failed.  "
                           "Build files cannot be regenerated correctly.");
    return ret;
  }
  std::string message = cmStrCat("Build files have been written to: ",
                                 this->GetHomeOutputDirectory());
  this->UpdateProgress(message, -1);
  return ret;
}